

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O0

void Mig_ManCreateChoices(Mig_Man_t *pMig,Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Mig_Obj_t *pMVar3;
  bool bVar4;
  Gia_Obj_t *local_38;
  Gia_Obj_t *pPrev;
  Gia_Obj_t *pSibl;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  Mig_Man_t *pMig_local;
  
  iVar1 = Mig_ManObjNum(pMig);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Mig_ManObjNum(pMig) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x32,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Vec_IntSize(&pMig->vSibls);
  if (iVar1 == 0) {
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFill(&pMig->vSibls,iVar1,0);
    Gia_ManMarkFanoutDrivers(p);
    pSibl._4_4_ = 0;
    while( true ) {
      bVar4 = false;
      if (pSibl._4_4_ < p->nObjs) {
        pGStack_20 = Gia_ManObj(p,pSibl._4_4_);
        bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      Gia_ObjSetPhase(p,pGStack_20);
      iVar1 = Abc_Lit2Var(pGStack_20->Value);
      if (iVar1 != pSibl._4_4_) {
        __assert_fail("Abc_Lit2Var(pObj->Value) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                      ,0x39,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
      }
      pMVar3 = Mig_ManObj(pMig,pSibl._4_4_);
      Mig_ObjSetPhase(pMVar3,(uint)((ulong)*(undefined8 *)pGStack_20 >> 0x3f));
      iVar1 = Gia_ObjSibl(p,pSibl._4_4_);
      if ((iVar1 != 0) && ((*(ulong *)pGStack_20 >> 0x1e & 1) != 0)) {
        local_38 = pGStack_20;
        pPrev = Gia_ObjSiblObj(p,pSibl._4_4_);
        while (pPrev != (Gia_Obj_t *)0x0) {
          iVar1 = Abc_Lit2Var(local_38->Value);
          pMVar3 = Mig_ManObj(pMig,iVar1);
          iVar1 = Abc_Lit2Var(pPrev->Value);
          Mig_ObjSetSiblId(pMVar3,iVar1);
          local_38 = pPrev;
          iVar1 = Gia_ObjId(p,pPrev);
          pPrev = Gia_ObjSiblObj(p,iVar1);
        }
        pMig->nChoices = pMig->nChoices + 1;
      }
      pSibl._4_4_ = pSibl._4_4_ + 1;
    }
    Gia_ManCleanMark0(p);
    return;
  }
  __assert_fail("Vec_IntSize(&pMig->vSibls) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                ,0x33,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mig_ManCreateChoices( Mig_Man_t * pMig, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Mig_ManObjNum(pMig) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(&pMig->vSibls) == 0 );
    Vec_IntFill( &pMig->vSibls, Gia_ManObjNum(p), 0 );
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjSetPhase( p, pObj );
        assert( Abc_Lit2Var(pObj->Value) == i );
        Mig_ObjSetPhase( Mig_ManObj(pMig, i), pObj->fPhase );
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                Mig_ObjSetSiblId( Mig_ManObj(pMig, Abc_Lit2Var(pPrev->Value)), Abc_Lit2Var(pSibl->Value) );
            pMig->nChoices++;
        }
    }
    Gia_ManCleanMark0( p );
}